

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlBufferEmpty(xmlBufferPtr buf)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  
  if ((buf != (xmlBufferPtr)0x0) && (pxVar1 = buf->content, pxVar1 != (xmlChar *)0x0)) {
    buf->use = 0;
    if (buf->alloc == XML_BUFFER_ALLOC_IO) {
      pxVar2 = buf->contentIO;
      if (pxVar2 != (xmlChar *)0x0) {
        buf->size = buf->size + ((int)pxVar1 - (int)pxVar2);
        buf->content = pxVar2;
        *pxVar2 = '\0';
        return;
      }
    }
    else if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
      buf->content = "";
      return;
    }
    *pxVar1 = '\0';
  }
  return;
}

Assistant:

void
xmlBufferEmpty(xmlBufferPtr buf) {
    if (buf == NULL) return;
    if (buf->content == NULL) return;
    buf->use = 0;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
        buf->content = BAD_CAST "";
    } else if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
               (buf->contentIO != NULL)) {
        size_t start_buf = buf->content - buf->contentIO;

	buf->size += start_buf;
        buf->content = buf->contentIO;
        buf->content[0] = 0;
    } else {
        buf->content[0] = 0;
    }
}